

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int x509_get_current_time(mbedtls_x509_time *now)

{
  tm *ptVar1;
  int local_24;
  time_t tStack_20;
  int ret;
  mbedtls_time_t tt;
  tm *lt;
  mbedtls_x509_time *now_local;
  
  local_24 = 0;
  lt = (tm *)now;
  tStack_20 = time((time_t *)0x0);
  ptVar1 = gmtime(&stack0xffffffffffffffe0);
  if (ptVar1 == (tm *)0x0) {
    local_24 = -1;
  }
  else {
    lt->tm_sec = ptVar1->tm_year + 0x76c;
    lt->tm_min = ptVar1->tm_mon + 1;
    lt->tm_hour = ptVar1->tm_mday;
    lt->tm_mday = ptVar1->tm_hour;
    lt->tm_mon = ptVar1->tm_min;
    lt->tm_year = ptVar1->tm_sec;
  }
  return local_24;
}

Assistant:

static int x509_get_current_time( mbedtls_x509_time *now )
{
    struct tm *lt;
    mbedtls_time_t tt;
    int ret = 0;

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_lock( &mbedtls_threading_gmtime_mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    tt = mbedtls_time( NULL );
    lt = gmtime( &tt );

    if( lt == NULL )
        ret = -1;
    else
    {
        now->year = lt->tm_year + 1900;
        now->mon  = lt->tm_mon  + 1;
        now->day  = lt->tm_mday;
        now->hour = lt->tm_hour;
        now->min  = lt->tm_min;
        now->sec  = lt->tm_sec;
    }

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &mbedtls_threading_gmtime_mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}